

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::getProgramInterface
          (VaryingComponentsTest *this,GLuint test_case_index,ProgramInterface *program_interface,
          VaryingPassthrough *varying_passthrough)

{
  testCase *test_case;
  pointer ptVar1;
  pointer __src;
  ProgramInterface *program_interface_00;
  VaryingPassthrough *varying_passthrough_00;
  int iVar2;
  pointer __dest;
  size_t __n;
  ulong uVar3;
  ShaderInterface si;
  Type local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  ProgramInterface *local_c8;
  VaryingPassthrough *local_c0;
  ShaderInterface local_b8;
  
  local_c0 = varying_passthrough;
  iVar2 = (**(code **)((long)(this->super_VaryingLocationsTest).super_TextureTestBase.super_TestBase
                             .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 0x110))
                    ();
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f0._0_8_ = (ulong)ptVar1[test_case_index].m_type | 0x100000000;
  local_f0.m_n_rows = 4;
  local_c8 = program_interface;
  Utils::ShaderInterface::ShaderInterface(&local_b8,&program_interface->m_vertex);
  Utils::Type::GenerateDataPacked(&local_e0,&local_f0);
  uVar3 = (ulong)(iVar2 + (uint)(iVar2 == 0));
  __n = (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_data,__n * uVar3);
  __src = local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  test_case = ptVar1 + test_case_index;
  __dest = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    memcpy(__dest,__src,__n);
    varying_passthrough_00 = local_c0;
    program_interface_00 = local_c8;
    __dest = __dest + __n;
    uVar3 = uVar3 - 1;
  } while (uVar3 != 0);
  prepareShaderStage(this,FRAGMENT,&local_f0,local_c8,test_case,local_c0);
  prepareShaderStage(this,GEOMETRY,&local_f0,program_interface_00,test_case,varying_passthrough_00);
  prepareShaderStage(this,TESS_CTRL,&local_f0,program_interface_00,test_case,varying_passthrough_00)
  ;
  prepareShaderStage(this,TESS_EVAL,&local_f0,program_interface_00,test_case,varying_passthrough_00)
  ;
  prepareShaderStage(this,VERTEX,&local_f0,program_interface_00,test_case,varying_passthrough_00);
  if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.m_ssb_blocks.
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.m_ssb_blocks.
                    super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.m_ssb_blocks.
                          super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.m_ssb_blocks.
                          super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.m_uniforms.
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.m_uniforms.
                    super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.m_uniforms.
                          super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.m_uniforms.
                          super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.m_outputs.
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.m_outputs.
                    super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.m_outputs.
                          super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.m_outputs.
                          super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.m_inputs.
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.m_inputs.
                    super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.m_inputs.
                          super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.m_inputs.
                          super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_globals._M_dataplus._M_p != &local_b8.m_globals.field_2) {
    operator_delete(local_b8.m_globals._M_dataplus._M_p,
                    local_b8.m_globals.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void VaryingComponentsTest::getProgramInterface(GLuint test_case_index, Utils::ProgramInterface& program_interface,
												Utils::VaryingPassthrough& varying_passthrough)
{
	GLuint				   array_length = getArrayLength();
	const testCase&		   test_case	= m_test_cases[test_case_index];
	const Utils::Type	  vector_type  = Utils::Type::GetType(test_case.m_type, 1, 4);
	Utils::ShaderInterface si			= program_interface.GetShaderInterface(Utils::Shader::VERTEX);

	/* Zero means no array, however we still need at least 1 slot of data */
	if (0 == array_length)
	{
		array_length += 1;
	}

	/* Generate data */
	const std::vector<GLubyte>& data	  = vector_type.GenerateDataPacked();
	const size_t				data_size = data.size();

	/* Prepare data for variables */
	m_data.resize(array_length * data_size);

	GLubyte*	   dst = &m_data[0];
	const GLubyte* src = &data[0];

	for (GLuint i = 0; i < array_length; ++i)
	{
		memcpy(dst + data_size * i, src, data_size);
	}

	/* Prepare interface for each stage */
	prepareShaderStage(Utils::Shader::FRAGMENT, vector_type, program_interface, test_case, varying_passthrough);
	prepareShaderStage(Utils::Shader::GEOMETRY, vector_type, program_interface, test_case, varying_passthrough);
	prepareShaderStage(Utils::Shader::TESS_CTRL, vector_type, program_interface, test_case, varying_passthrough);
	prepareShaderStage(Utils::Shader::TESS_EVAL, vector_type, program_interface, test_case, varying_passthrough);
	prepareShaderStage(Utils::Shader::VERTEX, vector_type, program_interface, test_case, varying_passthrough);
}